

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c-wrapper.h
# Opt level: O3

string * __thiscall
wasm::generateWasm2CWrapper_abi_cxx11_(string *__return_storage_ptr__,wasm *this,Module *wasm)

{
  Type *this_00;
  ulong uVar1;
  long lVar2;
  wasm *this_01;
  size_t sVar3;
  char cVar4;
  long *plVar5;
  Type *pTVar6;
  ulong uVar7;
  long *plVar8;
  size_t *psVar9;
  undefined8 *puVar10;
  ulong extraout_RDX;
  char cVar11;
  char *__assertion;
  Type in_R9;
  bool bVar12;
  size_type *psVar13;
  long *plVar14;
  undefined1 auVar15 [16];
  Name name;
  Name NVar16;
  Signature sig;
  undefined1 local_248 [8];
  Iterator __begin2;
  Type local_c0;
  Type result;
  ulong local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  size_type *local_70;
  string __str;
  long local_40;
  long lStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "\n#include <inttypes.h>\n#include <stdint.h>\n#include <stdio.h>\n\n#include \"wasm-rt-impl.h\"\n#include \"wasm.h\"\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi(u32 x) {\n  printf(\"[LoggingExternalInterface logging %d]\\n\", x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi)(u32) = _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj(u64 x) {\n  printf(\"[LoggingExternalInterface logging %\" PRId64 \"]\\n\", (int64_t)x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj)(u64) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii(u32 x, u32 y) {\n  printf(\"[LoggingExternalInterface logging %d %d]\\n\", x, y);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii)(u32, u32) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf(f32 x) {\n  printf(\"[LoggingExternalInterface logging %.17e]\\n\", x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf)(f32) = _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd(f64 x) {\n  printf(\"[LoggingExternalInterface logging %.17le]\\n\", x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd)(f64) = _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd;\n\n// Miscellaneous imports\n\nu32 tempRet0 = 0;\n\nvoid _Z_envZ_setTempRet0Z_vi(u32 x) {\n  tempRet0 = x;\n}\nvoid (*Z_envZ_setTempRet0Z_vi)(u32) = _Z_envZ_setTempRet0Z_vi;\n\nu32 _Z_envZ_getTempRet0Z_iv(void) {\n  return tempRet0;\n}\nu32 (*Z_envZ_getTempRet0Z_iv)(void) = _Z_envZ_getTempRet0Z_iv;\n\n// Main\n\nint main(int argc, char** argv) {\n  init();\n\n  // We go through each export and call it, in turn. Note that we use a loop\n  // so we can do all this with a single setjmp. A setjmp is needed to handle\n  // wasm traps, and emitting a single one helps compilation speed into wasm as\n  // compile times are O(size * num_setjmps).\n  for (size_t curr = 0;; curr++) {\n  "
             ,"");
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  plVar14 = *(long **)this;
  result.id = *(uintptr_t *)(this + 8);
  if (plVar14 != (long *)result.id) {
    local_98 = 0;
    do {
      psVar13 = &__str._M_string_length;
      if (*(int *)(*plVar14 + 0x10) == 0) {
        cVar11 = '\x01';
        if (9 < local_98) {
          uVar7 = local_98;
          cVar4 = '\x04';
          do {
            cVar11 = cVar4;
            if (uVar7 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_001a83d0;
            }
            if (uVar7 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_001a83d0;
            }
            if (uVar7 < 10000) goto LAB_001a83d0;
            bVar12 = 99999 < uVar7;
            uVar7 = uVar7 / 10000;
            cVar4 = cVar11 + '\x04';
          } while (bVar12);
          cVar11 = cVar11 + '\x01';
        }
LAB_001a83d0:
        local_70 = psVar13;
        std::__cxx11::string::_M_construct((ulong)&local_70,cVar11);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_70,(uint)__str._M_dataplus._M_p,local_98);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1dccf1);
        __str.field_2._8_8_ = &local_40;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_40 = *plVar8;
          lStack_38 = plVar5[3];
        }
        else {
          local_40 = *plVar8;
          __str.field_2._8_8_ = (long *)*plVar5;
        }
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
        local_248 = (undefined1  [8])
                    &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index;
        psVar9 = (size_t *)(plVar5 + 2);
        if ((size_t *)*plVar5 == psVar9) {
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               *psVar9;
        }
        else {
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               *psVar9;
          local_248 = (undefined1  [8])*plVar5;
        }
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_248);
        if (local_248 !=
            (undefined1  [8])
            &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
          operator_delete((void *)local_248,
                          __begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                          + 1);
        }
        if ((long *)__str.field_2._8_8_ != &local_40) {
          operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
        }
        if (local_70 != psVar13) {
          operator_delete(local_70,__str._M_string_length + 1);
        }
        puVar10 = (undefined8 *)(*plVar14 + 0x18);
        if (*(char *)(*plVar14 + 0x28) != '\0') {
          puVar10 = (undefined8 *)0x0;
        }
        NVar16.super_IString.str._M_str = (char *)*puVar10;
        NVar16.super_IString.str._M_len = (size_t)this;
        ::wasm::Module::getFunction(NVar16);
        local_70 = psVar13;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"          puts(\"[fuzz-exec] calling ","");
        lVar2 = ((long *)*plVar14)[1];
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,lVar2,*(long *)*plVar14 + lVar2);
        uVar7 = 0xf;
        if (local_70 != psVar13) {
          uVar7 = __str._M_string_length;
        }
        uVar1 = local_88 + CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p);
        if (uVar7 < uVar1) {
          in_R9.id = (uintptr_t)local_80;
          uVar7 = 0xf;
          if (local_90 != (ulong *)in_R9.id) {
            uVar7 = local_80[0];
          }
          if (uVar7 < uVar1) goto LAB_001a85c1;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
        }
        else {
LAB_001a85c1:
          puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90)
          ;
        }
        __str.field_2._8_8_ = &local_40;
        plVar5 = puVar10 + 2;
        if ((long *)*puVar10 == plVar5) {
          local_40 = *plVar5;
          lStack_38 = puVar10[3];
        }
        else {
          local_40 = *plVar5;
          __str.field_2._8_8_ = (long *)*puVar10;
        }
        *puVar10 = plVar5;
        puVar10[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
        local_248 = (undefined1  [8])
                    &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index;
        psVar9 = (size_t *)(plVar5 + 2);
        if ((size_t *)*plVar5 == psVar9) {
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               *psVar9;
        }
        else {
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               *psVar9;
          local_248 = (undefined1  [8])*plVar5;
        }
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_248);
        if (local_248 !=
            (undefined1  [8])
            &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
          operator_delete((void *)local_248,
                          __begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                          + 1);
        }
        if ((long *)__str.field_2._8_8_ != &local_40) {
          operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        if (local_70 != psVar13) {
          operator_delete(local_70,__str._M_string_length + 1);
        }
        ::wasm::HeapType::getSignature();
        local_c0.id = extraout_RDX;
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (extraout_RDX != 0) {
          local_70 = psVar13;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"printf(\"[fuzz-exec] note result: ","");
          lVar2 = ((long *)*plVar14)[1];
          local_90 = local_80;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,lVar2,*(long *)*plVar14 + lVar2);
          uVar7 = 0xf;
          if (local_70 != psVar13) {
            uVar7 = __str._M_string_length;
          }
          uVar1 = local_88 + CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p);
          if (uVar7 < uVar1) {
            in_R9.id = (uintptr_t)local_80;
            uVar7 = 0xf;
            if (local_90 != (ulong *)in_R9.id) {
              uVar7 = local_80[0];
            }
            if (uVar7 < uVar1) goto LAB_001a87bf;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
          }
          else {
LAB_001a87bf:
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
          }
          __str.field_2._8_8_ = &local_40;
          plVar5 = puVar10 + 2;
          if ((long *)*puVar10 == plVar5) {
            local_40 = *plVar5;
            lStack_38 = puVar10[3];
          }
          else {
            local_40 = *plVar5;
            __str.field_2._8_8_ = (long *)*puVar10;
          }
          *puVar10 = plVar5;
          puVar10[1] = 0;
          *(undefined1 *)plVar5 = 0;
          plVar5 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
          local_248 = (undefined1  [8])
                      &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       index;
          psVar9 = (size_t *)(plVar5 + 2);
          if ((size_t *)*plVar5 == psVar9) {
            __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                 *psVar9;
          }
          else {
            __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                 *psVar9;
            local_248 = (undefined1  [8])*plVar5;
          }
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_248);
          if (local_248 !=
              (undefined1  [8])
              &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
            operator_delete((void *)local_248,
                            __begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index + 1);
          }
          if ((long *)__str.field_2._8_8_ != &local_40) {
            operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
          }
          if (local_90 != local_80) {
            operator_delete(local_90,local_80[0] + 1);
          }
          if (local_70 != psVar13) {
            operator_delete(local_70,__str._M_string_length + 1);
          }
          if ((extraout_RDX & 1) != 0 && 6 < extraout_RDX) {
            __assertion = "!result.isTuple() && \"Unexpected tuple type\"";
LAB_001a8b2e:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm2c-wrapper.h"
                          ,0xab,"std::string wasm::generateWasm2CWrapper(Module &)");
          }
          if (6 < extraout_RDX) {
            __assertion = "result.isBasic() && \"TODO: handle compound types\"";
            goto LAB_001a8b2e;
          }
          if (3 < (int)extraout_RDX - 2U) {
            Fatal::Fatal((Fatal *)local_248);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .index,"unhandled wasm2c wrapper result type: ",0x26);
            Fatal::operator<<((Fatal *)local_248,&local_c0);
            Fatal::~Fatal((Fatal *)local_248);
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        this_01 = *(wasm **)*plVar14;
        sVar3 = ((undefined8 *)*plVar14)[1];
        auVar15 = ::wasm::HeapType::getSignature();
        name.super_IString.str._M_str = auVar15._0_8_;
        name.super_IString.str._M_len = sVar3;
        sig.results.id = in_R9.id;
        sig.params.id = auVar15._8_8_;
        wasm2cMangle_abi_cxx11_((string *)local_248,this_01,name,sig);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_248);
        if (local_248 !=
            (undefined1  [8])
            &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
          operator_delete((void *)local_248,
                          __begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                          + 1);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        __str.field_2._8_8_ = ::wasm::HeapType::getSignature();
        this_00 = (Type *)((long)&__str.field_2 + 8);
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        local_248 = (undefined1  [8])this_00;
        pTVar6 = (Type *)Type::size(this_00);
        if ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
             pTVar6) || (local_248 != (undefined1  [8])this_00)) {
          bVar12 = true;
          do {
            ::wasm::Type::Iterator::operator*((Iterator *)local_248);
            if (!bVar12) {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)((long)&(__begin2.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1);
            bVar12 = false;
          } while ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    parent != pTVar6) || (local_248 != (undefined1  [8])((long)&__str.field_2 + 8)))
          ;
        }
        if (extraout_RDX != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        local_98 = local_98 + 1;
      }
      plVar14 = plVar14 + 1;
    } while (plVar14 != (long *)result.id);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline std::string generateWasm2CWrapper(Module& wasm) {
  // First, emit implementations of the wasm's imports so that the wasm2c code
  // can call them. The names use wasm2c's name mangling.
  std::string ret = R"(
#include <inttypes.h>
#include <stdint.h>
#include <stdio.h>

#include "wasm-rt-impl.h"
#include "wasm.h"

void _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi(u32 x) {
  printf("[LoggingExternalInterface logging %d]\n", x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi)(u32) = _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi;

void _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj(u64 x) {
  printf("[LoggingExternalInterface logging %" PRId64 "]\n", (int64_t)x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj)(u64) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj;

void _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii(u32 x, u32 y) {
  printf("[LoggingExternalInterface logging %d %d]\n", x, y);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii)(u32, u32) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii;

void _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf(f32 x) {
  printf("[LoggingExternalInterface logging %.17e]\n", x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf)(f32) = _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf;

void _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd(f64 x) {
  printf("[LoggingExternalInterface logging %.17le]\n", x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd)(f64) = _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd;

// Miscellaneous imports

u32 tempRet0 = 0;

void _Z_envZ_setTempRet0Z_vi(u32 x) {
  tempRet0 = x;
}
void (*Z_envZ_setTempRet0Z_vi)(u32) = _Z_envZ_setTempRet0Z_vi;

u32 _Z_envZ_getTempRet0Z_iv(void) {
  return tempRet0;
}
u32 (*Z_envZ_getTempRet0Z_iv)(void) = _Z_envZ_getTempRet0Z_iv;

// Main

int main(int argc, char** argv) {
  init();

  // We go through each export and call it, in turn. Note that we use a loop
  // so we can do all this with a single setjmp. A setjmp is needed to handle
  // wasm traps, and emitting a single one helps compilation speed into wasm as
  // compile times are O(size * num_setjmps).
  for (size_t curr = 0;; curr++) {
  )";
  ret += R"(
    // Prepare to call the export, so we can catch traps.
    if (WASM_RT_SETJMP(g_jmp_buf) != 0) {
      puts("exception!");
    } else {
      // Call the proper export.
      switch(curr) {
)";

  // For each function export in the wasm, emit code to call it and log its
  // result, similar to the other wrappers.
  size_t functionExportIndex = 0;

  for (auto& exp : wasm.exports) {
    if (exp->kind != ExternalKind::Function) {
      continue;
    }

    ret += "        case " + std::to_string(functionExportIndex++) + ":\n";

    auto* func = wasm.getFunction(*exp->getInternalName());

    ret += std::string("          puts(\"[fuzz-exec] calling ") +
           exp->name.toString() + "\");\n";
    auto result = func->getResults();

    // Emit the call itself.
    ret += "            ";
    if (result != Type::none) {
      ret += std::string("printf(\"[fuzz-exec] note result: ") +
             exp->name.toString() + " => ";
      TODO_SINGLE_COMPOUND(result);
      switch (result.getBasic()) {
        case Type::i32:
          ret += "%d\\n\", ";
          break;
        case Type::i64:
          ret += "%\" PRId64 \"\\n\", (int64_t)";
          break;
        case Type::f32:
          ret += "%.17e\\n\", ";
          break;
        case Type::f64:
          ret += "%.17le\\n\", ";
          break;
        default:
          Fatal() << "unhandled wasm2c wrapper result type: " << result;
      }
    }

    // Call the export.
    ret += "(*";

    // Emit the callee's name with wasm2c name mangling.
    ret += wasm2cMangle(exp->name, func->getSig());

    ret += ")(";

    // Emit the parameters (all 0s, like the other wrappers).
    bool first = true;
    for ([[maybe_unused]] const auto& param : func->getParams()) {
      if (!first) {
        ret += ", ";
      }
      ret += "0";
      first = false;
    }
    if (result != Type::none) {
      ret += ")";
    }
    ret += ");\n";

    // Break from the big switch.
    ret += "          break;\n";
  }

  ret += R"(        default:
          return 0; // All done.
      }
    }
  }
  return 0;
}
)";

  return ret;
}